

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_1112d1a::HandleTargetMode
               (cmExecutionStatus *status,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names,string *propertyName,string *propertyValue,bool appendAsString,bool appendMode
               ,bool remove)

{
  cmMakefile *this;
  bool bVar1;
  cmTarget *this_00;
  _Rb_tree_node_base *p_Var2;
  element_type *peVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  undefined1 local_88 [16];
  undefined1 local_78 [32];
  undefined1 local_58 [40];
  
  p_Var2 = (names->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(names->_M_t)._M_impl.super__Rb_tree_header) {
      return true;
    }
    bVar1 = cmMakefile::IsAlias(status->Makefile,(string *)((long)p_Var2 + 0x20U));
    if (bVar1) break;
    this_00 = cmMakefile::FindTargetToUse(status->Makefile,(string *)((long)p_Var2 + 0x20U),false);
    if (this_00 == (cmTarget *)0x0) {
      local_78._8_8_ = *(undefined8 *)((long)p_Var2 + 0x20);
      local_78._0_8_ = ((_Rb_tree_node_base *)((long)p_Var2 + 0x20))->_M_parent;
      local_88._0_8_ = (element_type *)0x16;
      local_88._8_8_ = "could not find TARGET ";
      local_78._16_8_ = 0x27;
      local_78._24_8_ = ".  Perhaps it has not yet been created.";
      views._M_len = 3;
      views._M_array = (iterator)local_88;
      cmCatViews_abi_cxx11_((string *)local_58,views);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      peVar3 = (element_type *)local_58._0_8_;
      if ((element_type *)local_58._0_8_ == (element_type *)(local_58 + 0x10)) {
        return false;
      }
      goto LAB_00347790;
    }
    this = status->Makefile;
    if (appendMode) {
      cmMakefile::GetBacktrace(this);
      local_88._0_8_ = local_58._0_8_;
      local_88._8_8_ = local_58._8_8_;
      local_58._0_8_ = (element_type *)0x0;
      local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_78[0] = 1;
      cmTarget::AppendProperty
                (this_00,propertyName,propertyValue,(optional<cmListFileBacktrace> *)local_88,
                 appendAsString);
      if (((bool)local_78[0] == true) &&
         (local_78._0_8_ = local_78._0_8_ & 0xffffffffffffff00,
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
    }
    else if (remove) {
      cmTarget::SetProperty(this_00,propertyName,(char *)0x0);
    }
    else {
      cmTarget::SetProperty(this_00,propertyName,(cmValue)propertyValue);
    }
    cmTarget::CheckProperty(this_00,propertyName,this);
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  }
  local_88._0_8_ = (element_type *)local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"can not be used on an ALIAS target.","");
  std::__cxx11::string::_M_assign((string *)&status->Error);
  local_58._16_8_ = local_78._0_8_;
  peVar3 = (element_type *)local_88._0_8_;
  if ((element_type *)local_88._0_8_ == (element_type *)local_78) {
    return false;
  }
LAB_00347790:
  operator_delete(peVar3,(ulong)((long)&((_Base_ptr)local_58._16_8_)->_M_color + 1));
  return false;
}

Assistant:

bool HandleTargetMode(cmExecutionStatus& status,
                      const std::set<std::string>& names,
                      const std::string& propertyName,
                      const std::string& propertyValue, bool appendAsString,
                      bool appendMode, bool remove)
{
  for (std::string const& name : names) {
    if (status.GetMakefile().IsAlias(name)) {
      status.SetError("can not be used on an ALIAS target.");
      return false;
    }
    if (cmTarget* target = status.GetMakefile().FindTargetToUse(name)) {
      // Handle the current target.
      if (!HandleTarget(target, status.GetMakefile(), propertyName,
                        propertyValue, appendAsString, appendMode, remove)) {
        return false;
      }
    } else {
      status.SetError(cmStrCat("could not find TARGET ", name,
                               ".  Perhaps it has not yet been created."));
      return false;
    }
  }
  return true;
}